

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupDfs(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Abc_Cex_t *pAVar5;
  bool bVar6;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManFillValue(p);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCi(p,local_24);
      bVar6 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGStack_20->Value = uVar2;
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCo(p,local_24);
      bVar6 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pGVar4 = Gia_ObjFanin0(pGStack_20);
    Gia_ManDupDfs_rec(p_00,p,pGVar4);
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCo(p,local_24);
      bVar6 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_20);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    pGStack_20->Value = uVar2;
    local_24 = local_24 + 1;
  }
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  p_00->nConstrs = p->nConstrs;
  if (p->pCexSeq != (Abc_Cex_t *)0x0) {
    pAVar5 = p->pCexSeq;
    iVar1 = Gia_ManRegNum(p);
    pAVar5 = Abc_CexDup(pAVar5,iVar1);
    p_00->pCexSeq = pAVar5;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupDfs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    if ( p->pCexSeq )
        pNew->pCexSeq = Abc_CexDup( p->pCexSeq, Gia_ManRegNum(p) );
    return pNew;
}